

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::rpc_session::~rpc_session(rpc_session *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  rpc_session *in_RDI;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>
  *in_stack_ffffffffffffffc0;
  string local_28 [40];
  
  close_socket(in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x28e425);
    iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (5 < iVar2) {
      in_stack_ffffffffffffffc0 =
           (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
           std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x28e451);
      msg_if_given_abi_cxx11_((char *)local_28,"asio rpc session destroyed: %p",in_RDI);
      (*(code *)(in_stack_ffffffffffffffc0->next_layer_->
                super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.executor_.
                super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                .super_any_executor_base.target_)
                (in_stack_ffffffffffffffc0,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"~rpc_session",0xf9,local_28);
      std::__cxx11::string::~string(local_28);
    }
  }
  std::__cxx11::string::~string((string *)&in_RDI->cached_address_);
  std::function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)>::~function
            ((function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *)0x28e4ca);
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x28e4db);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x28e4ec);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x28e4fd);
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::~stream
            (in_stack_ffffffffffffffc0);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::~basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)0x28e51c);
  std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x28e52a);
  std::enable_shared_from_this<nuraft::rpc_session>::~enable_shared_from_this
            ((enable_shared_from_this<nuraft::rpc_session> *)0x28e534);
  return;
}

Assistant:

~rpc_session() {
        close_socket();
        p_tr("asio rpc session destroyed: %p", this);
    }